

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowControl.hpp
# Opt level: O2

void InstructionSet::x86::Primitive::
     ret_near<InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Instruction<false> instruction,Context *context)

{
  uint16_t *puVar1;
  unsigned_short uVar2;
  short local_1c [2];
  
  uVar2 = pop<unsigned_short,false,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                    (context);
  local_1c[0] = 0;
  local_1c[1] = instruction.extensions_[0];
  puVar1 = &(context->registers).sp_;
  *puVar1 = *puVar1 + *(short *)((long)local_1c + (ulong)((uint)((ulong)instruction >> 0xc) & 2));
  ((context->flow_controller).registers_)->ip_ = uVar2;
  return;
}

Assistant:

void ret_near(
	InstructionT instruction,
	ContextT &context
) {
	const auto ip = pop<uint16_t, false>(context);
	context.registers.sp() += instruction.operand();
	context.flow_controller.template jump<uint16_t>(ip);
}